

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ModportClockingPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportClockingPortSyntax,slang::syntax::ModportClockingPortSyntax_const&>
          (BumpAllocator *this,ModportClockingPortSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  ModportClockingPortSyntax *pMVar13;
  
  pMVar13 = (ModportClockingPortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ModportClockingPortSyntax *)this->endPtr < pMVar13 + 1) {
    pMVar13 = (ModportClockingPortSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pMVar13 + 1);
  }
  (pMVar13->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pMVar13->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pMVar13->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pMVar13->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pMVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pMVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5
  ;
  (pMVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pMVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pMVar13->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00c8c940;
  (pMVar13->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pMVar13->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pMVar13->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pMVar13->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00c8c880;
  uVar6 = (args->clocking).field_0x2;
  NVar7.raw = (args->clocking).numFlags.raw;
  uVar8 = (args->clocking).rawLen;
  pIVar3 = (args->clocking).info;
  TVar9 = (args->name).kind;
  uVar10 = (args->name).field_0x2;
  NVar11.raw = (args->name).numFlags.raw;
  uVar12 = (args->name).rawLen;
  pIVar4 = (args->name).info;
  (pMVar13->clocking).kind = (args->clocking).kind;
  (pMVar13->clocking).field_0x2 = uVar6;
  (pMVar13->clocking).numFlags = (NumericTokenFlags)NVar7.raw;
  (pMVar13->clocking).rawLen = uVar8;
  (pMVar13->clocking).info = pIVar3;
  (pMVar13->name).kind = TVar9;
  (pMVar13->name).field_0x2 = uVar10;
  (pMVar13->name).numFlags = (NumericTokenFlags)NVar11.raw;
  (pMVar13->name).rawLen = uVar12;
  (pMVar13->name).info = pIVar4;
  return pMVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }